

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alGetSourceiv(void)

{
  uint32 name_00;
  ALenum param_00;
  uint32 numvals_00;
  int32 iVar1;
  ALint *origvalues_00;
  ALint *local_260;
  uint local_258;
  uint32 i;
  ALboolean isenum;
  ALint *values;
  uint32 numvals;
  ALint *origvalues;
  ALenum param;
  ALuint name;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)&param);
  if (io_failure == 0) {
    name_00 = IO_UINT32();
    param_00 = IO_ENUM();
    origvalues_00 = (ALint *)IO_PTR();
    numvals_00 = IO_UINT32();
    if (numvals_00 == 0) {
      local_260 = (ALint *)0x0;
    }
    else {
      local_260 = (ALint *)get_ioblob((ulong)numvals_00 << 2);
    }
    for (local_258 = 0; local_258 < numvals_00; local_258 = local_258 + 1) {
      iVar1 = IO_INT32();
      local_260[local_258] = iVar1;
    }
    if (io_failure == 0) {
      visit_alGetSourceiv((CallerInfo *)&param,name_00,param_00,param_00 == 0x1010,origvalues_00,
                          numvals_00,local_260);
    }
  }
  return;
}

Assistant:

static void decode_alGetSourceiv(void)
{
    IO_START(alGetSourceiv);
    const ALuint name = IO_UINT32();
    const ALenum param = IO_ENUM();
    ALint *origvalues = (ALint *) IO_PTR();
    const uint32 numvals = IO_UINT32();
    ALint *values = (ALint *) (numvals ? get_ioblob(sizeof (ALfloat) * numvals) : NULL);
    ALboolean isenum = AL_FALSE;
    uint32 i;

    for (i = 0; i < numvals; i++) {
        values[i] = IO_INT32();
    }

    switch (param) {
        case AL_SOURCE_STATE: isenum = AL_TRUE;
        default: break;
    }

    if (!io_failure) visit_alGetSourceiv(&callerinfo, name, param, isenum, origvalues, numvals, values);

    IO_END();
}